

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::SetMessagePbInterval
          (Generator *this,Descriptor *descriptor)

{
  long lVar1;
  int i;
  long lVar2;
  long lVar3;
  EnumDescriptorProto proto;
  DescriptorProto message_proto;
  string local_1a8;
  EnumDescriptorProto local_188;
  DescriptorProto local_118;
  
  DescriptorProto::DescriptorProto(&local_118);
  ModuleLevelDescriptorName<google::protobuf::Descriptor>((string *)&local_188,this,descriptor);
  PrintSerializedPbInterval<google::protobuf::Descriptor,google::protobuf::DescriptorProto>
            (this,descriptor,&local_118,(string *)&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  lVar3 = 0;
  for (lVar2 = 0; lVar2 < *(int *)(descriptor + 0x70); lVar2 = lVar2 + 1) {
    SetMessagePbInterval(this,(Descriptor *)(*(long *)(descriptor + 0x38) + lVar3));
    lVar3 = lVar3 + 0x88;
  }
  lVar2 = 0;
  for (lVar3 = 0; lVar3 < *(int *)(descriptor + 0x74); lVar3 = lVar3 + 1) {
    EnumDescriptorProto::EnumDescriptorProto(&local_188);
    lVar1 = *(long *)(descriptor + 0x40);
    ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>
              (&local_1a8,this,(EnumDescriptor *)(lVar1 + lVar2));
    PrintSerializedPbInterval<google::protobuf::EnumDescriptor,google::protobuf::EnumDescriptorProto>
              (this,(EnumDescriptor *)(lVar1 + lVar2),&local_188,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    EnumDescriptorProto::~EnumDescriptorProto(&local_188);
    lVar2 = lVar2 + 0x48;
  }
  DescriptorProto::~DescriptorProto(&local_118);
  return;
}

Assistant:

void Generator::SetMessagePbInterval(const Descriptor& descriptor) const {
  DescriptorProto message_proto;
  PrintSerializedPbInterval(descriptor, message_proto,
                            ModuleLevelDescriptorName(descriptor));

  // Nested messages.
  for (int i = 0; i < descriptor.nested_type_count(); ++i) {
    SetMessagePbInterval(*descriptor.nested_type(i));
  }

  for (int i = 0; i < descriptor.enum_type_count(); ++i) {
    EnumDescriptorProto proto;
    const EnumDescriptor& enum_des = *descriptor.enum_type(i);
    PrintSerializedPbInterval(enum_des, proto,
                              ModuleLevelDescriptorName(enum_des));
  }
}